

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t utf16_to_unicode(uint32_t *pwc,char *s,size_t n,wchar_t be)

{
  ushort uVar1;
  int in_ECX;
  ulong in_RDX;
  void *in_RSI;
  uint *in_RDI;
  uint uc2;
  uint uc;
  char *utf16;
  uint local_38;
  uint local_34;
  void *local_30;
  wchar_t local_4;
  
  if (in_RDX == 0) {
    local_4 = L'\0';
  }
  else if (in_RDX == 1) {
    *in_RDI = 0xfffd;
    local_4 = L'\xffffffff';
  }
  else {
    if (in_ECX == 0) {
      uVar1 = archive_le16dec(in_RSI);
    }
    else {
      uVar1 = archive_be16dec(in_RSI);
    }
    local_34 = (uint)uVar1;
    local_30 = (void *)((long)in_RSI + 2);
    if ((0xd7ff < local_34) && (local_34 < 0xdc00)) {
      if (in_RDX < 4) {
        local_38 = 0;
      }
      else {
        if (in_ECX == 0) {
          uVar1 = archive_le16dec(local_30);
        }
        else {
          uVar1 = archive_be16dec(local_30);
        }
        local_38 = (uint)uVar1;
      }
      if ((local_38 < 0xdc00) || (0xdfff < local_38)) {
        *in_RDI = 0xfffd;
        return L'\xfffffffe';
      }
      local_34 = combine_surrogate_pair(local_34,local_38);
      local_30 = (void *)((long)in_RSI + 4);
    }
    if (((local_34 < 0xd800) || (0xdfff < local_34)) && (local_34 < 0x110000)) {
      *in_RDI = local_34;
      local_4 = (int)local_30 - (int)in_RSI;
    }
    else {
      *in_RDI = 0xfffd;
      local_4 = -((int)local_30 - (int)in_RSI);
    }
  }
  return local_4;
}

Assistant:

static int
utf16_to_unicode(uint32_t *pwc, const char *s, size_t n, int be)
{
	const char *utf16 = s;
	unsigned uc;

	if (n == 0)
		return (0);
	if (n == 1) {
		/* set the Replacement Character instead. */
		*pwc = UNICODE_R_CHAR;
		return (-1);
	}

	if (be)
		uc = archive_be16dec(utf16);
	else
		uc = archive_le16dec(utf16);
	utf16 += 2;
		
	/* If this is a surrogate pair, assemble the full code point.*/
	if (IS_HIGH_SURROGATE_LA(uc)) {
		unsigned uc2;

		if (n >= 4) {
			if (be)
				uc2 = archive_be16dec(utf16);
			else
				uc2 = archive_le16dec(utf16);
		} else
			uc2 = 0;
		if (IS_LOW_SURROGATE_LA(uc2)) {
			uc = combine_surrogate_pair(uc, uc2);
			utf16 += 2;
		} else {
	 		/* Undescribed code point should be U+FFFD
		 	* (replacement character). */
			*pwc = UNICODE_R_CHAR;
			return (-2);
		}
	}

	/*
	 * Surrogate pair values(0xd800 through 0xdfff) are only
	 * used by UTF-16, so, after above culculation, the code
	 * must not be surrogate values, and Unicode has no codes
	 * larger than 0x10ffff. Thus, those are not leagal Unicode
	 * values.
	 */
	if (IS_SURROGATE_PAIR_LA(uc) || uc > UNICODE_MAX) {
	 	/* Undescribed code point should be U+FFFD
	 	* (replacement character). */
		*pwc = UNICODE_R_CHAR;
		return (((int)(utf16 - s)) * -1);
	}
	*pwc = uc;
	return ((int)(utf16 - s));
}